

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O0

int ikcp_wndsize(ikcpcb *kcp,int sndwnd,int rcvwnd)

{
  IUINT32 local_24;
  int rcvwnd_local;
  int sndwnd_local;
  ikcpcb *kcp_local;
  
  if (kcp != (ikcpcb *)0x0) {
    if (0 < sndwnd) {
      kcp->snd_wnd = sndwnd;
    }
    if (0 < rcvwnd) {
      local_24 = rcvwnd;
      if ((uint)rcvwnd < 0x80) {
        local_24 = 0x80;
      }
      kcp->rcv_wnd = local_24;
    }
  }
  return 0;
}

Assistant:

int ikcp_wndsize(ikcpcb *kcp, int sndwnd, int rcvwnd)
{
	if (kcp) {
		if (sndwnd > 0) {
			kcp->snd_wnd = sndwnd;
		}
		if (rcvwnd > 0) {   // must >= max fragment size
			kcp->rcv_wnd = _imax_(rcvwnd, IKCP_WND_RCV);
		}
	}
	return 0;
}